

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O2

void __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::left4(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int n,SPxId id)

{
  cpp_dec_float<50U,_int,_void> *u;
  uint *puVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar5;
  ulong uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  beta_q;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhov_1;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (id.super_DataKey.info != 0) {
    pSVar3 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8.data._M_elems[9]._1_3_ = 0;
    local_e8.exp = 0;
    local_e8.neg = false;
    pnVar4 = (pSVar3->theFvec->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68._37_8_ = 0;
    local_128.data._M_elems[0] = 1;
    local_128.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              (&local_68,(longlong *)&local_128,&pnVar4[n].m_backend);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::length2((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_a8,
              &((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->theCoPvec->thedelta);
    local_168.fpclass = cpp_dec_float_finite;
    local_168.prec_elem = 10;
    local_168.data._M_elems[0] = 0;
    local_168.data._M_elems[1] = 0;
    local_168.data._M_elems[2] = 0;
    local_168.data._M_elems[3] = 0;
    local_168.data._M_elems[4] = 0;
    local_168.data._M_elems[5] = 0;
    local_168.data._M_elems._24_5_ = 0;
    local_168.data._M_elems[7]._1_3_ = 0;
    local_168.data._M_elems._32_5_ = 0;
    local_168.data._M_elems[9]._1_3_ = 0;
    local_168.exp = 0;
    local_168.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_168,&local_a8,&local_68);
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems._24_5_ = 0;
    local_128.data._M_elems[7]._1_3_ = 0;
    local_128.data._M_elems._32_5_ = 0;
    local_128.data._M_elems[9]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_128,&local_168,&local_68);
    pUVar5 = ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->theFvec;
    for (uVar6 = (ulong)(uint)(pUVar5->thedelta).super_IdxSet.num; 0 < (int)uVar6; uVar6 = uVar6 - 1
        ) {
      iVar2 = (pUVar5->thedelta).super_IdxSet.idx[uVar6 - 1];
      u = &pnVar4[iVar2].m_backend;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_a8,u,u);
      local_168.fpclass = cpp_dec_float_finite;
      local_168.prec_elem = 10;
      local_168.data._M_elems[0] = 0;
      local_168.data._M_elems[1] = 0;
      local_168.data._M_elems[2] = 0;
      local_168.data._M_elems[3] = 0;
      local_168.data._M_elems[4] = 0;
      local_168.data._M_elems[5] = 0;
      local_168.data._M_elems._24_5_ = 0;
      local_168.data._M_elems[7]._1_3_ = 0;
      local_168.data._M_elems._32_5_ = 0;
      local_168.data._M_elems[9]._1_3_ = 0;
      local_168.exp = 0;
      local_168.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_168,&local_a8,&local_128);
      local_e8.data._M_elems._32_5_ = local_168.data._M_elems._32_5_;
      local_e8.data._M_elems[9]._1_3_ = local_168.data._M_elems[9]._1_3_;
      local_e8.data._M_elems[4] = local_168.data._M_elems[4];
      local_e8.data._M_elems[5] = local_168.data._M_elems[5];
      local_e8.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
      local_e8.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
      local_e8.data._M_elems[0] = local_168.data._M_elems[0];
      local_e8.data._M_elems[1] = local_168.data._M_elems[1];
      local_e8.data._M_elems[2] = local_168.data._M_elems[2];
      local_e8.data._M_elems[3] = local_168.data._M_elems[3];
      local_e8.exp = local_168.exp;
      local_e8.neg = local_168.neg;
      local_e8.fpclass = local_168.fpclass;
      local_e8.prec_elem = local_168.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(pSVar3->coWeights).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend,&local_e8);
    }
    pnVar4 = (pSVar3->coWeights).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)&pnVar4[n].m_backend.data + 0x20) =
         CONCAT35(local_128.data._M_elems[9]._1_3_,local_128.data._M_elems._32_5_);
    puVar1 = (uint *)((long)&pnVar4[n].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_128.data._M_elems._16_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(local_128.data._M_elems[7]._1_3_,local_128.data._M_elems._24_5_);
    *(undefined8 *)&pnVar4[n].m_backend.data = local_128.data._M_elems._0_8_;
    *(undefined8 *)((long)&pnVar4[n].m_backend.data + 8) = local_128.data._M_elems._8_8_;
    pnVar4[n].m_backend.exp = local_128.exp;
    pnVar4[n].m_backend.neg = local_128.neg;
    pnVar4[n].m_backend.fpclass = local_128.fpclass;
    pnVar4[n].m_backend.prec_elem = local_128.prec_elem;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }